

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

int av1_get_active_map(AV1_COMP *cpi,uchar *new_map_16x16,int rows,int cols)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint8_t *puVar9;
  
  iVar4 = -1;
  if ((((cpi->common).mi_params.mb_rows == rows) && (iVar4 = -1, new_map_16x16 != (uchar *)0x0)) &&
     ((cpi->common).mi_params.mb_cols == cols)) {
    puVar9 = (cpi->enc_seg).map;
    iVar1 = (cpi->common).mi_params.mi_rows;
    iVar2 = (cpi->common).mi_params.mi_cols;
    memset(new_map_16x16,(uint)((cpi->active_map).enabled == 0),(long)(rows * cols));
    iVar4 = 0;
    if (((cpi->active_map).enabled != 0) && (uVar8 = iVar1 >> 2, 0 < (int)uVar8)) {
      puVar5 = puVar9 + (long)iVar2 + 1;
      lVar3 = (long)iVar2 * 2;
      puVar9 = puVar9 + 1;
      uVar6 = 0;
      do {
        if (0 < iVar2 >> 2) {
          uVar7 = 0;
          do {
            new_map_16x16[uVar7] =
                 new_map_16x16[uVar7] |
                 (puVar5[uVar7 * 2] != '\a' ||
                 (puVar5[uVar7 * 2 + -1] != '\a' ||
                 (puVar9[uVar7 * 2] != '\a' || puVar9[uVar7 * 2 + -1] != '\a')));
            uVar7 = uVar7 + 1;
          } while ((uint)(iVar2 >> 2) != uVar7);
        }
        uVar6 = uVar6 + 1;
        new_map_16x16 = new_map_16x16 + cols;
        puVar5 = puVar5 + lVar3;
        puVar9 = puVar9 + lVar3;
      } while (uVar6 != uVar8);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int av1_get_active_map(AV1_COMP *cpi, unsigned char *new_map_16x16, int rows,
                       int cols) {
  const CommonModeInfoParams *const mi_params = &cpi->common.mi_params;
  if (rows == mi_params->mb_rows && cols == mi_params->mb_cols &&
      new_map_16x16) {
    unsigned char *const seg_map_8x8 = cpi->enc_seg.map;
    const int mi_rows = mi_params->mi_rows;
    const int mi_cols = mi_params->mi_cols;
    const int row_scale = mi_size_high_log2[BLOCK_16X16];
    const int col_scale = mi_size_wide_log2[BLOCK_16X16];
    assert(mi_rows % 2 == 0);
    assert(mi_cols % 2 == 0);

    memset(new_map_16x16, !cpi->active_map.enabled, rows * cols);
    if (cpi->active_map.enabled) {
      for (int r = 0; r < (mi_rows >> row_scale); ++r) {
        for (int c = 0; c < (mi_cols >> col_scale); ++c) {
          // Cyclic refresh segments are considered active despite not having
          // AM_SEGMENT_ID_ACTIVE
          uint8_t temp = 0;
          temp |= seg_map_8x8[(2 * r + 0) * mi_cols + (2 * c + 0)] !=
                  AM_SEGMENT_ID_INACTIVE;
          temp |= seg_map_8x8[(2 * r + 0) * mi_cols + (2 * c + 1)] !=
                  AM_SEGMENT_ID_INACTIVE;
          temp |= seg_map_8x8[(2 * r + 1) * mi_cols + (2 * c + 0)] !=
                  AM_SEGMENT_ID_INACTIVE;
          temp |= seg_map_8x8[(2 * r + 1) * mi_cols + (2 * c + 1)] !=
                  AM_SEGMENT_ID_INACTIVE;
          new_map_16x16[r * cols + c] |= temp;
        }
      }
    }
    return 0;
  }

  return -1;
}